

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O2

vector<Vector3<double>,_std::allocator<Vector3<double>_>_> * __thiscall
s2coding::EncodedS2PointVector::Decode
          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__return_storage_ptr__,
          EncodedS2PointVector *this)

{
  int i;
  uint i_00;
  S2Point SStack_38;
  
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (__return_storage_ptr__,(ulong)this->size_);
  for (i_00 = 0; i_00 < this->size_; i_00 = i_00 + 1) {
    operator[](&SStack_38,this,i_00);
    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::emplace_back<Vector3<double>>
              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)__return_storage_ptr__,
               &SStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Point> EncodedS2PointVector::Decode() const {
  vector<S2Point> points;
  points.reserve(size_);
  for (int i = 0; i < size_; ++i) {
    points.push_back((*this)[i]);
  }
  return points;
}